

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

slot_type * __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
::slot_array(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
             *this)

{
  bool bVar1;
  
  bVar1 = is_soo(this);
  if (!bVar1) {
    return (slot_type *)
           (this->settings_).
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.slot_array.p;
  }
  __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x101b,
                "slot_type *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<long, long>, absl::hash_internal::Hash<long>, std::equal_to<long>, std::allocator<std::pair<const long, long>>>::slot_array() const [Policy = absl::container_internal::FlatHashMapPolicy<long, long>, Hash = absl::hash_internal::Hash<long>, Eq = std::equal_to<long>, Alloc = std::allocator<std::pair<const long, long>>]"
               );
}

Assistant:

slot_type* slot_array() const {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    return static_cast<slot_type*>(common().slot_array());
  }